

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void P_SerializePolyobjs(FArchive *arc)

{
  FArchive *pFVar1;
  int iVar2;
  TObjPtr<DInterpolation> *pTVar3;
  int data;
  int seg;
  undefined4 uStack_54;
  double dStack_50;
  DAngle local_40;
  DAngle angle;
  
  if (arc->m_Storing == true) {
    _seg = (double)CONCAT44(uStack_54,0x68);
    pFVar1 = FArchive::operator<<(arc,(DWORD *)&seg);
    FArchive::operator<<(pFVar1,(DWORD *)&po_NumPolyobjs);
    pTVar3 = &polyobjs->interpolation;
    for (iVar2 = 0; iVar2 < po_NumPolyobjs; iVar2 = iVar2 + 1) {
      pFVar1 = FArchive::operator<<(arc,(DWORD *)(pTVar3 + -8));
      pFVar1 = operator<<(pFVar1,(DAngle *)(pTVar3 + -9));
      pFVar1 = operator<<(pFVar1,(DVector2 *)(pTVar3 + -0x13));
      pFVar1 = operator<<(pFVar1,(DInterpolation **)pTVar3);
      pFVar1 = FArchive::operator<<(pFVar1,(bool *)((long)(pTVar3 + -5) + 5));
      FArchive::operator<<(pFVar1,(BYTE *)((long)(pTVar3 + -5) + 6));
      operator<<(arc,(DPolyAction **)(pTVar3 + -1));
      pTVar3 = pTVar3 + 0x1e;
    }
  }
  else {
    FArchive::operator<<(arc,(DWORD *)&data);
    if (data != 0x68) {
      I_Error("Polyobject marker missing");
    }
    FArchive::operator<<(arc,(DWORD *)&data);
    if (data != po_NumPolyobjs) {
      I_Error("UnarchivePolyobjs: Bad polyobj count");
    }
    pTVar3 = &polyobjs->interpolation;
    for (iVar2 = 0; iVar2 < po_NumPolyobjs; iVar2 = iVar2 + 1) {
      FArchive::operator<<(arc,(DWORD *)&data);
      if (data != *(int *)(pTVar3 + -8)) {
        I_Error("UnarchivePolyobjs: Invalid polyobj tag");
      }
      pFVar1 = operator<<(arc,&angle);
      pFVar1 = operator<<(pFVar1,(DVector2 *)&seg);
      operator<<(pFVar1,(DInterpolation **)pTVar3);
      FArchive::operator<<(arc,(bool *)((long)(pTVar3 + -5) + 5));
      FArchive::operator<<(arc,(BYTE *)((long)(pTVar3 + -5) + 6));
      if (0x11c3 < SaveVersion) {
        operator<<(arc,(DPolyAction **)(pTVar3 + -1));
      }
      local_40.Degrees = angle.Degrees;
      FPolyObj::RotatePolyobj((FPolyObj *)(pTVar3 + -0x1d),&local_40,true);
      _seg = _seg - (((FPolyVertex *)(pTVar3 + -0x13))->pos).X;
      dStack_50 = dStack_50 - *(double *)(pTVar3 + -0x12);
      FPolyObj::MovePolyobj((FPolyObj *)(pTVar3 + -0x1d),(DVector2 *)&seg,true);
      pTVar3 = pTVar3 + 0x1e;
    }
  }
  return;
}

Assistant:

void P_SerializePolyobjs (FArchive &arc)
{
	int i;
	FPolyObj *po;

	if (arc.IsStoring ())
	{
		int seg = ASEG_POLYOBJS;
		arc << seg << po_NumPolyobjs;
		for(i = 0, po = polyobjs; i < po_NumPolyobjs; i++, po++)
		{
			arc << po->tag << po->Angle << po->StartSpot.pos << po->interpolation << po->bBlocked << po->bHasPortals;
			arc << po->specialdata;
  		}
	}
	else
	{
		int data;
		DAngle angle;
		DVector2 delta;

		arc << data;
		if (data != ASEG_POLYOBJS)
			I_Error ("Polyobject marker missing");

		arc << data;
		if (data != po_NumPolyobjs)
		{
			I_Error ("UnarchivePolyobjs: Bad polyobj count");
		}
		for (i = 0, po = polyobjs; i < po_NumPolyobjs; i++, po++)
		{
			arc << data;
			if (data != po->tag)
			{
				I_Error ("UnarchivePolyobjs: Invalid polyobj tag");
			}
			arc << angle << delta << po->interpolation;
			arc << po->bBlocked;
			arc << po->bHasPortals;
			if (SaveVersion >= 4548)
			{
				arc << po->specialdata;
			}

			po->RotatePolyobj (angle, true);
			delta -= po->StartSpot.pos;
			po->MovePolyobj (delta, true);
		}
	}
}